

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall DepthShader::fragment(DepthShader *this,Model *model,vec3f bar,TGAColor *color)

{
  TGAColor TVar1;
  TGAColor local_30;
  vec<3UL,_double> local_28;
  
  operator*(&local_28,&this->varying_tri,&bar);
  local_30.bgra[0] = 0xff;
  local_30.bgra[1] = 0xff;
  local_30.bgra[2] = 0xff;
  local_30.bgra[3] = 0xff;
  local_30.bytespp = '\x04';
  TVar1 = TGAColor::operator*(&local_30,local_28.z / 500.0);
  *&color->bgra = TVar1.bgra;
  color->bytespp = TVar1.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f p = varying_tri * bar;
        color = TGAColor(255, 255, 255) * (p.z / 500.f);
        return false;
    }